

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsQueryExecuteAsync(HelicsQuery query,HelicsFederate fed,HelicsError *err)

{
  size_t *psVar1;
  bool bVar2;
  string_view target;
  string_view queryStr;
  string_view queryStr_00;
  shared_ptr<helics::Federate> fedObj;
  undefined1 local_2c [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (query == (HelicsQuery)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019b76c;
    }
    else {
      bVar2 = *(int *)((long)query + 0x7c) == 0x27063885;
      psVar1 = (size_t *)0x0;
      if (bVar2) {
        psVar1 = (size_t *)query;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_0019b76f;
    }
    err->error_code = -3;
    err->message = "Query object is invalid";
  }
LAB_0019b76c:
  psVar1 = (size_t *)0x0;
LAB_0019b76f:
  if (psVar1 != (size_t *)0x0) {
    getFedSharedPtr(local_2c + 4,(HelicsError *)fed);
    if (local_2c._4_8_ == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar1 + 8),0
                 ,psVar1[9],
                 "{{\n  \"error\":{{\n    \"code\":404,\n    \"message\":\"federate object is not valid\"\n  }}\n}}"
                 ,0x54);
    }
    else {
      if ((char *)psVar1[1] == (char *)0x0) {
        queryStr._M_str = (char *)psVar1[5];
        queryStr._M_len = local_2c._4_8_;
        helics::Federate::queryAsync((Federate *)local_2c,queryStr,(HelicsSequencingModes)psVar1[4])
        ;
      }
      else {
        target._M_str = (char *)psVar1[1];
        target._M_len = local_2c._4_8_;
        queryStr_00._M_str = (char *)psVar1[5];
        queryStr_00._M_len = *psVar1;
        helics::Federate::queryAsync
                  ((Federate *)local_2c,target,queryStr_00,(HelicsSequencingModes)psVar1[4]);
      }
      *(undefined4 *)(psVar1 + 0xf) = local_2c._0_4_;
      *(undefined1 *)(psVar1 + 0xe) = 1;
      psVar1[0xc] = local_2c._4_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(psVar1 + 0xd),&local_20);
    }
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
  }
  return;
}

Assistant:

void helicsQueryExecuteAsync(HelicsQuery query, HelicsFederate fed, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    auto fedObj = getFedSharedPtr(fed, err);
    if (fedObj == nullptr) {
        queryObj->response = invalidFedObConst;
        return;
    }
    try {
        if (queryObj->target.empty()) {
            queryObj->asyncIndexCode = fedObj->queryAsync(queryObj->query);
        } else {
            queryObj->asyncIndexCode = fedObj->queryAsync(queryObj->target, queryObj->query);
        }
        queryObj->activeAsync = true;
        queryObj->activeFed = fedObj;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}